

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

PmError Pm_Terminate(void)

{
  if (pm_initialized != 0) {
    pm_term();
    if (descriptors != (descriptor_type)0x0) {
      free(descriptors);
      descriptors = (descriptor_type)0x0;
    }
    pm_descriptor_index = 0;
    pm_descriptor_max = 0;
    pm_initialized = 0;
  }
  return pmNoData;
}

Assistant:

PMEXPORT PmError Pm_Terminate( void ) {
    if (pm_initialized) {
        pm_term();
        // if there are no devices, descriptors might still be NULL
        if (descriptors != NULL) {
            free(descriptors);
            descriptors = NULL;
        }
        pm_descriptor_index = 0;
        pm_descriptor_max = 0;
        pm_initialized = FALSE;
    }
    return pmNoError;
}